

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionhandler.c
# Opt level: O0

OPTIONHANDLER_HANDLE
CreateInternal(pfCloneOption cloneOption,pfDestroyOption destroyOption,pfSetOption setOption)

{
  LOGGER_LOG p_Var1;
  VECTOR_HANDLE pVVar2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  OPTIONHANDLER_HANDLE result;
  pfSetOption setOption_local;
  pfDestroyOption destroyOption_local;
  pfCloneOption cloneOption_local;
  
  l = (LOGGER_LOG)malloc(0x20);
  if (l == (LOGGER_LOG)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/optionhandler.c"
                ,"CreateInternal",0x20,1,"unable to malloc");
    }
  }
  else {
    pVVar2 = VECTOR_create(0x10);
    *(VECTOR_HANDLE *)(l + 0x18) = pVVar2;
    if (*(long *)(l + 0x18) == 0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/optionhandler.c"
                  ,"CreateInternal",0x2a,1,"unable to VECTOR_create");
      }
      free(l);
      l = (LOGGER_LOG)0x0;
    }
    else {
      *(pfCloneOption *)l = cloneOption;
      *(pfDestroyOption *)(l + 8) = destroyOption;
      *(pfSetOption *)(l + 0x10) = setOption;
    }
  }
  return (OPTIONHANDLER_HANDLE)l;
}

Assistant:

static OPTIONHANDLER_HANDLE CreateInternal(pfCloneOption cloneOption, pfDestroyOption destroyOption, pfSetOption setOption)
{
    OPTIONHANDLER_HANDLE result;

    result = (OPTIONHANDLER_HANDLE_DATA*)malloc(sizeof(OPTIONHANDLER_HANDLE_DATA));
    if (result == NULL)
    {
        /*Codes_SRS_OPTIONHANDLER_02_004: [ Otherwise, OptionHandler_Create shall fail and return NULL. ]*/
        LogError("unable to malloc");
        /*return as is*/
    }
    else
    {
        /*Codes_SRS_OPTIONHANDLER_02_002: [ OptionHandler_Create shall create an empty VECTOR that will hold pairs of const char* and void*. ]*/
        result->storage = VECTOR_create(sizeof(OPTION));
        if (result->storage == NULL)
        {
            /*Codes_SRS_OPTIONHANDLER_02_004: [ Otherwise, OptionHandler_Create shall fail and return NULL. ]*/
            LogError("unable to VECTOR_create");
            free(result);
            result = NULL;
        }
        else
        {
            /*Codes_SRS_OPTIONHANDLER_02_003: [ If all the operations succeed then OptionHandler_Create shall succeed and return a non-NULL handle. ]*/
            result->cloneOption = cloneOption;
            result->destroyOption = destroyOption;
            result->setOption = setOption;
            /*return as is*/
        }
    }

    return result;
}